

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckArray2DClose<float[2][2],float_const*const*,float>
               (TestResults *results,float (*expected) [2] [2],float ***actual,int rows,int columns,
               float *tolerance,TestDetails *details)

{
  float fVar1;
  ostream *poVar2;
  char *failure;
  bool bVar3;
  ulong uVar4;
  int actualRow;
  ulong uVar5;
  ulong uVar6;
  float (*pafVar7) [2];
  byte bVar8;
  int expectedRow;
  ulong uVar9;
  MemoryOutStream stream;
  undefined1 local_1c8 [408];
  
  if (0 < rows) {
    uVar6 = (ulong)(uint)columns;
    uVar5 = (ulong)(uint)rows;
    bVar3 = true;
    uVar4 = 0;
    pafVar7 = *expected;
    do {
      bVar8 = 1;
      if (0 < columns) {
        uVar9 = 0;
        do {
          fVar1 = (*(float (*) [2])*pafVar7)[uVar9];
          bVar8 = bVar8 & ((*actual)[uVar4][uVar9] <= *tolerance + fVar1 &&
                          fVar1 - *tolerance <= (*actual)[uVar4][uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      bVar3 = (bool)(bVar3 & bVar8);
      uVar4 = uVar4 + 1;
      pafVar7 = pafVar7 + 1;
    } while (uVar4 != uVar5);
    if (!bVar3) {
      MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Expected [ ",0xb);
      uVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar9 = 0;
          do {
            poVar2 = std::ostream::_M_insert<double>
                               ((double)(*(float (*) [2])(*expected)[0])[uVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar4 = uVar4 + 1;
        expected = (float (*) [2] [2])((long)expected + 8);
      } while (uVar4 != uVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] +/- ",6);
      poVar2 = std::ostream::_M_insert<double>((double)*tolerance);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," but was [ ",0xb);
      uVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar9 = 0;
          do {
            poVar2 = std::ostream::_M_insert<double>((double)(*actual)[uVar4][uVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"]",1);
      failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
      TestResults::OnTestFailure(results,details,failure);
      MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8,&MemoryOutStream::VTT);
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x90));
    }
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}